

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O3

void star_EBNF(Grammar *g)

{
  anon_struct_40_4_d8687ec6_for_rules *v;
  uint uVar1;
  Rule *pRVar2;
  Rule **ppRVar3;
  Production *pPVar4;
  Production *elem;
  Production *pPVar5;
  Elem *pEVar6;
  Production *pPVar7;
  Rule *pRVar8;
  void *elem_00;
  undefined4 *puVar9;
  int iVar10;
  Rule **ppRVar11;
  
  pPVar4 = new_internal_production(g,g->p);
  pPVar4->field_0x3c = pPVar4->field_0x3c & 0xe3 | 0xc;
  elem = (Production *)calloc(1,0xa8);
  *(Production **)&elem->name_len = pPVar4;
  pPVar5 = (Production *)calloc(1,0x20);
  elem->declaration_group[0] = pPVar5;
  *(undefined4 *)&pPVar5->name = 3;
  *(Production **)&pPVar5->name_len = elem;
  *(int *)(elem->last_declaration + 2) = g->action_index;
  if (g->right_recursive_BNF == 0) {
    pRVar8 = (Rule *)calloc(1,0x20);
    *(Production **)&pRVar8->op_priority = pPVar4;
    pRVar8->prod = elem;
    (elem->rules).e[1] = (Rule *)((elem->rules).e + 2);
    *(undefined4 *)(elem->rules).e = 1;
    (elem->rules).e[2] = pRVar8;
    pRVar8 = g->r;
    pEVar6 = (pRVar8->elems).v[(pRVar8->elems).n - 1];
    *(undefined4 *)(elem->rules).e = 2;
    *(Elem **)&elem->index = pEVar6;
    pEVar6 = (Elem *)calloc(1,0x20);
    (pEVar6->e).nterm = pPVar4;
    pEVar6->rule = pRVar8;
    (pRVar8->elems).v[(pRVar8->elems).n - 1] = pEVar6;
    pPVar5 = (elem->rules).e[1]->prod;
    pPVar7 = elem;
  }
  else {
    pRVar8 = g->r;
    pRVar2 = (Rule *)(pRVar8->elems).v[(pRVar8->elems).n - 1];
    (elem->rules).e[1] = (Rule *)((elem->rules).e + 2);
    *(undefined4 *)(elem->rules).e = 1;
    (elem->rules).e[2] = pRVar2;
    pEVar6 = (Elem *)calloc(1,0x20);
    (pEVar6->e).nterm = pPVar4;
    pEVar6->rule = pRVar8;
    (pRVar8->elems).v[(pRVar8->elems).n - 1] = pEVar6;
    pPVar5 = (Production *)(elem->rules).e[1];
    *(Production **)(pPVar5->name + 8) = elem;
    pPVar7 = (Production *)calloc(1,0x20);
    *(Production **)&pPVar7->rules = pPVar4;
    *(Production **)&pPVar7->name_len = elem;
    *(undefined4 *)(elem->rules).e = 2;
  }
  *(Production **)&pPVar5->name_len = pPVar7;
  v = &pPVar4->rules;
  ppRVar3 = (pPVar4->rules).v;
  ppRVar11 = (pPVar4->rules).e;
  if (ppRVar3 == (Rule **)0x0) {
    (pPVar4->rules).v = ppRVar11;
    uVar1 = (pPVar4->rules).n;
    (pPVar4->rules).n = uVar1 + 1;
    (pPVar4->rules).e[uVar1] = (Rule *)elem;
  }
  else {
    uVar1 = v->n;
    if (ppRVar3 == ppRVar11) {
      if (2 < uVar1) goto LAB_0013bc08;
    }
    else if ((uVar1 & 7) == 0) {
LAB_0013bc08:
      vec_add_internal(v,elem);
      goto LAB_0013bc13;
    }
    v->n = uVar1 + 1;
    ppRVar3[uVar1] = (Rule *)elem;
  }
LAB_0013bc13:
  ppRVar3 = (pPVar4->rules).v;
  if (ppRVar3 == (Rule **)0x0) {
    pRVar8 = (Rule *)calloc(1,0xa8);
    pRVar8->prod = pPVar4;
    pEVar6 = (Elem *)calloc(1,0x20);
    pRVar8->end = pEVar6;
    pEVar6->kind = ELEM_END;
    pEVar6->rule = pRVar8;
    pRVar8->action_index = g->action_index;
    (pPVar4->rules).v = ppRVar11;
    uVar1 = (pPVar4->rules).n;
    (pPVar4->rules).n = uVar1 + 1;
    (pPVar4->rules).e[uVar1] = pRVar8;
  }
  else {
    uVar1 = (pPVar4->rules).n;
    if (ppRVar3 == ppRVar11) {
      iVar10 = g->action_index;
      if (2 < uVar1) goto LAB_0013bd33;
      pRVar8 = (Rule *)calloc(1,0xa8);
      pRVar8->prod = pPVar4;
      pEVar6 = (Elem *)calloc(1,0x20);
      pRVar8->end = pEVar6;
      pEVar6->kind = ELEM_END;
      pEVar6->rule = pRVar8;
      pRVar8->action_index = iVar10;
    }
    else {
      iVar10 = g->action_index;
      if ((uVar1 & 7) == 0) {
LAB_0013bd33:
        elem_00 = calloc(1,0xa8);
        *(Production **)((long)elem_00 + 8) = pPVar4;
        puVar9 = (undefined4 *)calloc(1,0x20);
        *(undefined4 **)((long)elem_00 + 0x48) = puVar9;
        *puVar9 = 3;
        *(void **)(puVar9 + 2) = elem_00;
        *(int *)((long)elem_00 + 0x98) = iVar10;
        vec_add_internal(v,elem_00);
        return;
      }
      pRVar8 = (Rule *)calloc(1,0xa8);
      pRVar8->prod = pPVar4;
      pEVar6 = (Elem *)calloc(1,0x20);
      pRVar8->end = pEVar6;
      pEVar6->kind = ELEM_END;
      pEVar6->rule = pRVar8;
      pRVar8->action_index = iVar10;
    }
    (pPVar4->rules).n = uVar1 + 1;
    ppRVar3[uVar1] = pRVar8;
  }
  return;
}

Assistant:

void star_EBNF(Grammar *g) {
  Production *pp;
  Rule *rr;

  pp = new_internal_production(g, g->p);
  pp->internal = INTERNAL_STAR;
  rr = new_rule(g, pp);
  if (!g->right_recursive_BNF) {
    vec_add(&rr->elems, new_elem_nterm(pp, rr));
    vec_add(&rr->elems, last_elem(g->r));
    last_elem(g->r) = new_elem_nterm(pp, g->r);
    last_elem(rr)->rule = rr;
  } else {
    vec_add(&rr->elems, last_elem(g->r));
    last_elem(g->r) = new_elem_nterm(pp, g->r);
    last_elem(rr)->rule = rr;
    vec_add(&rr->elems, new_elem_nterm(pp, rr));
  }
  vec_add(&pp->rules, rr);
  vec_add(&pp->rules, new_rule(g, pp));
}